

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Precompute.cpp
# Opt level: O3

Pass * wasm::createPrecomputePropagatePass(void)

{
  Pass *pPVar1;
  
  pPVar1 = (Pass *)operator_new(0x180);
  pPVar1->runner = (PassRunner *)0x0;
  (pPVar1->name)._M_dataplus._M_p = (pointer)&(pPVar1->name).field_2;
  (pPVar1->name)._M_string_length = 0;
  (pPVar1->name).field_2._M_local_buf[0] = '\0';
  pPVar1[1]._vptr_Pass = (_func_int **)0x0;
  pPVar1[1].runner = (PassRunner *)0x0;
  pPVar1[4].name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pPVar1[4].name.field_2 + 8) = 0;
  pPVar1[5]._vptr_Pass = (_func_int **)0x0;
  pPVar1[5].runner = (PassRunner *)0x0;
  pPVar1[5].name._M_dataplus._M_p = (pointer)0x0;
  pPVar1->_vptr_Pass = (_func_int **)&PTR__Precompute_00d75028;
  *(undefined1 *)&pPVar1[5].name._M_string_length = 1;
  pPVar1[5].name.field_2._M_allocated_capacity = (size_type)&pPVar1[6].name.field_2;
  *(undefined8 *)((long)&pPVar1[5].name.field_2 + 8) = 1;
  pPVar1[6]._vptr_Pass = (_func_int **)0x0;
  pPVar1[6].runner = (PassRunner *)0x0;
  *(undefined4 *)&pPVar1[6].name._M_dataplus._M_p = 0x3f800000;
  pPVar1[6].name._M_string_length = 0;
  pPVar1[6].name.field_2._M_allocated_capacity = 0;
  *(undefined1 **)((long)&pPVar1[6].name.field_2 + 8) =
       (undefined1 *)((long)&pPVar1[7].name.field_2 + 8);
  pPVar1[7]._vptr_Pass = (_func_int **)0x1;
  pPVar1[7].runner = (PassRunner *)0x0;
  pPVar1[7].name._M_dataplus._M_p = (pointer)0x0;
  *(undefined4 *)&pPVar1[7].name._M_string_length = 0x3f800000;
  pPVar1[7].name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pPVar1[7].name.field_2 + 8) = 0;
  return pPVar1;
}

Assistant:

Pass* createPrecomputePropagatePass() { return new Precompute(true); }